

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O0

void __thiscall
bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>::insert
          (bitview<bv::internal::bitarray_t<4096UL>::array> *this,size_t index,bool bit)

{
  ulong uVar1;
  reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  byte in_DL;
  ulong in_RSI;
  array<unsigned_long,_64UL> *in_RDI;
  word_type newcarry;
  size_t j;
  word_type carry;
  word_type mask;
  word_type word;
  size_t pos;
  size_t i;
  size_type in_stack_ffffffffffffff88;
  array<unsigned_long,_64UL> *in_stack_ffffffffffffff90;
  undefined8 local_48;
  undefined8 local_40;
  
  local_48 = in_RSI >> 6;
  pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                     (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  uVar1 = *pvVar2;
  uVar3 = -1L << ((byte)in_RSI & 0x3f);
  pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                     (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *pvVar2 = (uVar1 & uVar3) << 1 | uVar1 & (uVar3 ^ 0xffffffffffffffff) |
            (ulong)(in_DL & 1) << ((byte)in_RSI & 0x3f);
  while( true ) {
    local_40 = uVar1 >> 0x3f;
    local_48 = local_48 + 1;
    sVar4 = std::array<unsigned_long,_64UL>::size(in_RDI);
    if (sVar4 <= local_48) break;
    pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    uVar1 = *pvVar2;
    in_stack_ffffffffffffff90 = (array<unsigned_long,_64UL> *)(uVar1 << 1 | local_40);
    pvVar2 = std::array<unsigned_long,_64UL>::operator[]
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    *pvVar2 = (value_type)in_stack_ffffffffffffff90;
  }
  return;
}

Assistant:

void bitview<Container>::insert(size_t index, bool bit)
        {
            size_t i = index / W;
            size_t pos = index % W;

            word_type word = _container[i];
            word_type mask = word_type(-1) << pos;

            word_type carry = word >> (W - 1);
            _container[i] = ((word &  mask) << 1)    | 
                             (word & ~mask)          | 
                             (word_type(bit) << pos);

            for(size_t j = i + 1; j < _container.size(); ++j) 
            {
                word = _container[j];
                word_type newcarry = word >> (W - 1);
                
                _container[j] = word << 1 | carry;
                carry = newcarry;
            }
        }